

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O1

void __thiscall async::threadpool_scheduler::schedule(threadpool_scheduler *this,task_run_handle *t)

{
  _Head_base<0UL,_async::detail::threadpool_data_*,_false> _Var1;
  thread_data_t *ptVar2;
  int iVar3;
  long lVar4;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  _Head_base<0UL,_async::detail::threadpool_data_*,_false> __mutex;
  __atomic_base<unsigned_long> _Var5;
  task_run_handle local_28;
  task_run_handle local_20;
  
  lVar4 = __tls_get_addr(&PTR_00108f98);
  __mutex._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
       ._M_t.
       super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
       .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl;
  if (*(pthread_mutex_t **)(lVar4 + 8) == (pthread_mutex_t *)__mutex._M_head_impl) {
    lVar4 = *(long *)(lVar4 + 0x10);
    ptVar2 = *(thread_data_t **)((long)&(__mutex._M_head_impl)->thread_data + 8);
    local_20 = (task_run_handle)(t->handle).p;
    (t->handle).p = (task_base *)0x0;
    detail::work_steal_queue::push(&ptVar2[lVar4].queue,&local_20);
    task_run_handle::~task_run_handle(&local_20);
    __mutex._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
         ._M_t.
         super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
         .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl;
    if (((__int_type)((__mutex._M_head_impl)->num_waiters).super___atomic_base<unsigned_long>)._M_i
        == 0) {
      return;
    }
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex._M_head_impl);
    if (iVar3 != 0) goto LAB_00104b13;
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
         ._M_t.
         super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
         .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl;
    _Var5._M_i = ((_Var1._M_head_impl)->num_waiters).super___atomic_base<unsigned_long>._M_i;
    if (_Var5._M_i == 0) goto LAB_00104b01;
    detail::task_wait_event::signal
              (*(task_wait_event **)
                ((long)((_Var1._M_head_impl)->waiters)._M_t + -8 + _Var5._M_i * 8),2,__handler_00);
  }
  else {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex._M_head_impl);
    if (iVar3 != 0) {
LAB_00104b13:
      std::__throw_system_error(iVar3);
    }
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
         ._M_t.
         super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
         .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl;
    local_28 = (task_run_handle)(t->handle).p;
    (t->handle).p = (task_base *)0x0;
    detail::fifo_queue::push(&(_Var1._M_head_impl)->public_queue,&local_28);
    task_run_handle::~task_run_handle(&local_28);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
         ._M_t.
         super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
         .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl;
    _Var5._M_i = ((_Var1._M_head_impl)->num_waiters).super___atomic_base<unsigned_long>._M_i;
    if (_Var5._M_i == 0) goto LAB_00104b01;
    detail::task_wait_event::signal
              (*(task_wait_event **)
                ((long)((_Var1._M_head_impl)->waiters)._M_t + -8 + _Var5._M_i * 8),2,__handler);
  }
  (((this->impl)._M_t.
    super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
    ._M_t.
    super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
    .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl)->num_waiters).
  super___atomic_base<unsigned_long> = (__atomic_base<unsigned_long>)(_Var5._M_i - 1);
LAB_00104b01:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_head_impl);
  return;
}

Assistant:

void threadpool_scheduler::schedule(task_run_handle t)
{
	detail::threadpool_data_wrapper wrapper = detail::get_threadpool_data_wrapper();
	
	// Check if we are in the thread pool
	if (wrapper.owning_threadpool == impl.get()) {
		// Push the task onto our task queue
		impl->thread_data[wrapper.thread_id].queue.push(std::move(t));

		// If there are no sleeping threads, just return. We check outside the
		// lock to avoid locking overhead in the fast path.
		if (impl->num_waiters.load(std::memory_order_relaxed) == 0)
			return;

		// Get a thread to wake up from the list
		std::lock_guard<std::mutex> locked(impl->lock);

		// Check again if there are waiters
		size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
		if (num_waiters_val == 0)
			return;

		// Pop a thread from the list and wake it up
		impl->waiters[num_waiters_val - 1]->signal(detail::wait_type::task_available);
		impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
	} else {
		std::lock_guard<std::mutex> locked(impl->lock);

		// Push task onto the public queue
		impl->public_queue.push(std::move(t));

		// Wake up a sleeping thread
		size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
		if (num_waiters_val == 0)
			return;
		impl->waiters[num_waiters_val - 1]->signal(detail::wait_type::task_available);
		impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
	}
}